

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

int donamelevel(void)

{
  char query [128];
  char buf [256];
  char local_198 [128];
  char local_118 [264];
  
  if (level->levname[0] == '\0') {
    builtin_strncpy(local_198 + 0x20,"ngeon level?",0xd);
    builtin_strncpy(local_198 + 0x10," to call this du",0x10);
    builtin_strncpy(local_198,"What do you want",0x10);
  }
  else {
    sprintf(local_198,"Replace previous name \"%s\" with?");
  }
  getlin(local_198,local_118);
  if (local_118[0] != '\x1b') {
    strncpy(level->levname,local_118,0x3f);
    level->levname[0x3f] = '\0';
  }
  return 0;
}

Assistant:

int donamelevel(void)
{
	char query[QBUFSZ], buf[BUFSZ];

	if (level->levname[0])
		sprintf(query, "Replace previous name \"%s\" with?", level->levname);
	else
		sprintf(query,"What do you want to call this dungeon level?");
	getlin(query, buf);

	if (buf[0] == '\033')
	    return 0;

	strncpy(level->levname, buf, sizeof(level->levname)-1);
	level->levname[sizeof(level->levname)-1] = '\0';
	return 0;
}